

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O3

uint64_t loader::exe_reader::get_file_version(istream *is)

{
  char cVar1;
  char cVar2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  BinaryType BVar7;
  undefined8 in_RAX;
  resource rVar8;
  uint64_t uVar9;
  uint uVar10;
  uint32_t uVar11;
  bool bVar12;
  char buffer [1];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  BVar7 = anon_unknown_0::determine_binary_type(is);
  uVar9 = 0xffffffffffffffff;
  if (BVar7 == VXDMagic) {
    std::istream::seekg((long)is,0xb6);
    std::istream::read((char *)is,(long)&uStack_38 + 4);
    uVar10 = uStack_38._4_4_;
    std::istream::read((char *)is,(long)&uStack_38 + 4);
    if (uStack_38._4_4_ < 0xd) {
      return 0xffffffffffffffff;
    }
    if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0) {
      return 0xffffffffffffffff;
    }
    std::istream::seekg(is,uVar10,0);
    std::istream::read((char *)is,(long)&uStack_38 + 4);
    cVar1 = uStack_38._4_1_;
    std::istream::read((char *)is,(long)&uStack_38 + 4);
    sVar3 = uStack_38._4_2_;
    std::istream::read((char *)is,(long)&uStack_38 + 4);
    cVar2 = uStack_38._4_1_;
    std::istream::seekg((long)is,4);
    std::istream::read((char *)is,(long)&uStack_38 + 4);
    if (uStack_38._4_4_ < 0x49) {
      return 0xffffffffffffffff;
    }
    if (cVar2 != -1) {
      return 0xffffffffffffffff;
    }
    if (sVar3 != 0x10) {
      return 0xffffffffffffffff;
    }
    if (cVar1 != -1) {
      return 0xffffffffffffffff;
    }
    if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0) {
      return 0xffffffffffffffff;
    }
    std::istream::read((char *)is,(long)&uStack_38 + 4);
    uVar4 = uStack_38._4_2_;
    std::istream::read((char *)is,(long)&uStack_38 + 4);
    uVar5 = uStack_38._4_2_;
    std::istream::seekg((long)is,0x10);
    if (uVar5 < 0x34) {
      return 0xffffffffffffffff;
    }
    if (uVar4 < 0x48) {
      return 0xffffffffffffffff;
    }
    if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0) {
      return 0xffffffffffffffff;
    }
  }
  else {
    if (BVar7 == PEMagic) {
      rVar8 = anon_unknown_0::pe_reader::find_resource(is,1,0x10,0xffffffff);
      uVar11 = rVar8.offset;
      if (uVar11 == 0) {
        return 0xffffffffffffffff;
      }
      std::istream::seekg(is,uVar11 + 6,0);
      uVar10 = 9;
      do {
        std::istream::read((char *)is,(long)&uStack_38 + 4);
        uVar6 = uStack_38._4_4_;
        if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) != 0) {
          return 0xffffffffffffffff;
        }
        uVar10 = uVar10 + 2;
        bVar12 = uStack_38._4_2_ != 0;
        uStack_38._4_4_ = uVar6;
      } while (bVar12);
    }
    else {
      if (BVar7 != OS2Magic) {
        return 0xffffffffffffffff;
      }
      rVar8 = anon_unknown_0::ne_reader::find_resource(is,1,0x10);
      if (rVar8.offset == 0) {
        return 0xffffffffffffffff;
      }
      uVar11 = rVar8.offset + 4;
      std::istream::seekg(is,uVar11,0);
      uVar10 = 3;
      do {
        std::istream::read((char *)is,(long)&uStack_38 + 4);
        uVar6 = uStack_38._4_4_;
        if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) != 0) {
          return 0xffffffffffffffff;
        }
        uVar10 = uVar10 + 1;
        bVar12 = uStack_38._4_1_ != '\0';
        uStack_38._4_4_ = uVar6;
      } while (bVar12);
    }
    std::istream::seekg(is,(uVar10 & 0xfffffffc) + uVar11,0);
  }
  std::istream::read((char *)is,(long)&uStack_38 + 4);
  if ((uStack_38._4_4_ == 0xfeef04bd) &&
     ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) == 0)) {
    std::istream::seekg((long)is,4);
    std::istream::read((char *)is,(long)&uStack_38 + 4);
    uVar10 = uStack_38._4_4_;
    std::istream::read((char *)is,(long)&uStack_38 + 4);
    uVar9 = -(ulong)(((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) != 0) |
            CONCAT44(uVar10,uStack_38._4_4_);
  }
  return uVar9;
}

Assistant:

boost::uint64_t exe_reader::get_file_version(std::istream & is) {
	
	bool found = false;
	BinaryType bintype = determine_binary_type(is);
	switch(bintype) {
		case OS2Magic: found = ne_reader::get_file_version(is); break;
		case VXDMagic: found = le_reader::get_file_version(is); break;
		case PEMagic:  found = pe_reader::get_file_version(is); break;
		default: break;
	}
	if(!found) {
		return FileVersionUnknown;
	}
	
	boost::uint32_t magic = util::load<boost::uint32_t>(is);
	if(is.fail() || magic != 0xfeef04bd) {
		return FileVersionUnknown;
	}
	
	is.seekg(4, std::ios_base::cur); // skip struct version
	boost::uint32_t file_version_ms = util::load<boost::uint32_t>(is);
	boost::uint32_t file_version_ls = util::load<boost::uint32_t>(is);
	if(is.fail()) {
		return FileVersionUnknown;
	}
	
	return (boost::uint64_t(file_version_ms) << 32) | boost::uint64_t(file_version_ls);
}